

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF.h
# Opt level: O2

char * Assimp::IFF::ReadHeader(uint8_t *outFile,uint32_t *fileType)

{
  if (*(int *)outFile == 0x4d524f46) {
    *fileType = *(uint32_t *)(outFile + 8);
    ByteSwap::Swap4(fileType);
    return (char *)0x0;
  }
  return "The file is not an IFF file: FORM chunk is missing";
}

Assistant:

inline const char* ReadHeader(uint8_t* outFile, uint32_t& fileType)
{
    ChunkHeader head = LoadChunk(outFile);
    if(AI_IFF_FOURCC_FORM != head.type)
    {
        return "The file is not an IFF file: FORM chunk is missing";
    }
    ::memcpy(&fileType, outFile, 4);
    AI_LSWAP4(fileType);
    return 0;
}